

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g80_atom32.cc
# Opt level: O0

int atom32_check_data(hwtest_ctx *ctx,uint32_t op1,uint32_t op2,uint32_t *src1,uint32_t *src2,
                     uint32_t *src3,uint32_t xtra)

{
  uint uVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_8c;
  bool is_atom;
  uint32_t expold;
  uint32_t s3;
  uint32_t s2;
  uint32_t s1;
  uint8_t sz;
  uint uStack_74;
  uint8_t op;
  uint32_t ecc;
  uint32_t exp;
  uint32_t realold;
  uint32_t cc;
  uint32_t real;
  int i;
  uint32_t *src3_local;
  uint32_t *src2_local;
  uint32_t *src1_local;
  uint32_t op2_local;
  uint32_t op1_local;
  hwtest_ctx *ctx_local;
  
  cc = 0;
  while( true ) {
    if (0x1ff < (int)cc) {
      return 0;
    }
    uVar3 = nva_rd32(ctx->cnum,cc * 4 + 0x700000);
    uVar4 = nva_rd32(ctx->cnum,cc * 4 + 0x700800);
    uVar5 = nva_rd32(ctx->cnum,cc * 4 + 0x701000);
    bVar2 = (byte)(op2 >> 0x15) & 7;
    uVar1 = src1[(int)cc];
    expold = src2[(int)cc];
    if (bVar2 < 2) {
      expold = (expold & 0xff) * 0x1010101;
    }
    else if (bVar2 < 4) {
      expold = (expold & 0xffff) * 0x10001;
    }
    uStack_74 = uVar1;
    switch((byte)(op2 >> 2) & 0xf) {
    case 0:
      uStack_74 = uVar1 + expold;
      break;
    case 1:
      uStack_74 = expold;
      break;
    case 2:
      if (uVar1 == expold) {
        uStack_74 = src3[(int)cc];
      }
      break;
    default:
      abort();
    case 4:
      uStack_74 = uVar1 + 1;
      if (expold < uStack_74) {
        uStack_74 = 0;
      }
      if ((((ctx->chipset).chipset < 0xa0) && (bVar2 == 7)) &&
         (((int)expold < 0 &&
          ((uStack_74 = uVar1 + 1, 0 < (int)uStack_74 || ((int)uStack_74 < (int)expold)))))) {
        uStack_74 = expold;
      }
      break;
    case 5:
      uStack_74 = uVar1 - 1;
      if (expold < uStack_74) {
        uStack_74 = expold;
      }
      if (((((ctx->chipset).chipset < 0xa0) && (bVar2 == 7)) && ((int)expold < 0)) &&
         ((uStack_74 = uVar1 - 1, 0 < (int)uStack_74 || ((int)uStack_74 < (int)expold)))) {
        uStack_74 = 0;
      }
      break;
    case 6:
      if (bVar2 == 7) {
        local_9c = uVar1;
        if ((int)uVar1 <= (int)expold) {
          local_9c = expold;
        }
        uStack_74 = local_9c;
      }
      else {
        local_a0 = uVar1;
        if (uVar1 <= expold) {
          local_a0 = expold;
        }
        uStack_74 = local_a0;
      }
      break;
    case 7:
      if (bVar2 == 7) {
        local_a4 = uVar1;
        if ((int)expold <= (int)uVar1) {
          local_a4 = expold;
        }
        uStack_74 = local_a4;
      }
      else {
        local_a8 = uVar1;
        if (expold <= uVar1) {
          local_a8 = expold;
        }
        uStack_74 = local_a8;
      }
      break;
    case 8:
    case 9:
    case 0xd:
    case 0xe:
    case 0xf:
      break;
    case 10:
      uStack_74 = uVar1 & expold;
      break;
    case 0xb:
      uStack_74 = uVar1 | expold;
      break;
    case 0xc:
      uStack_74 = uVar1 ^ expold;
    }
    if ((bVar2 < 4) && (0x9f < (ctx->chipset).chipset)) {
      uStack_74 = uVar1;
    }
    local_8c = uVar1;
    switch(bVar2) {
    case 0:
      local_8c = uVar1 & 0xff;
      break;
    case 1:
      local_8c = (uint)(char)uVar1;
      break;
    case 2:
      local_8c = uVar1 & 0xffff;
      break;
    case 3:
      local_8c = (uint)(short)uVar1;
    }
    if (((uVar3 != uStack_74) || (uVar4 != 0xf)) || ((op2 >> 0x1d == 7 && (uVar5 != local_8c))))
    break;
    cc = cc + 1;
  }
  printf("atom32 %08x %08x (%08x %08x %08x %08x)[%d]: got %08x.%x %08x expected %08x.%x %08x\n",
         (ulong)op1,(ulong)op2,(ulong)src1[(int)cc],(ulong)src2[(int)cc],(ulong)src3[(int)cc],uVar1,
         cc & 3,uVar3,uVar4,uVar5,uStack_74,0xf,local_8c);
  return 1;
}

Assistant:

static int atom32_check_data(struct hwtest_ctx *ctx, uint32_t op1, uint32_t op2, const uint32_t *src1, const uint32_t *src2, const uint32_t *src3, uint32_t xtra) {
	int i;
	for (i = 0; i < 0x200; i++) {
		uint32_t real = nva_rd32(ctx->cnum, 0x700000 + i * 4);
		uint32_t cc = nva_rd32(ctx->cnum, 0x700800 + i * 4);
		uint32_t realold = nva_rd32(ctx->cnum, 0x701000 + i * 4);
		uint32_t exp, ecc = 0xf;
		uint8_t op = (op2 >> 2) & 0xf;
		uint8_t sz = (op2 >> 21) & 7;
		uint32_t s1 = src1[i];
		uint32_t s2 = src2[i];
		uint32_t s3 = src3[i];
		uint32_t expold = s1;
		bool is_atom = (op2 >> 29) == 7;
		if (sz < 2)
			s2 = (uint8_t)s2 * 0x01010101;
		else if (sz < 4)
			s2 = (uint16_t)s2 * 0x00010001;
		switch (op) {
			case 0: /* add */
				exp = s1 + s2;
				break;
			case 1: /* exch */
				exp = s2;
				break;
			case 2: /* cas */
				if (s1 == s2)
					exp = s3;
				else
					exp = s1;
				break;
			case 4: /* inc */
				exp = s1 + 1;
				if (exp > s2)
					exp = 0;
				if (ctx->chipset.chipset < 0xa0 && sz == 7 && (int32_t)s2 < 0) {
					exp = s1 + 1;
					if ((int32_t)exp > 0 || (int32_t)s2 > (int32_t)exp)
						exp = s2;
				}
				break;
			case 5: /* dec */
				exp = s1 - 1;
				if (exp > s2)
					exp = s2;
				if (ctx->chipset.chipset < 0xa0 && sz == 7 && (int32_t)s2 < 0) {
					exp = s1 - 1;
					if ((int32_t)exp > 0 || (int32_t)s2 > (int32_t)exp)
						exp = 0;
				}
				break;
			case 6: /* max */
				if (sz == 7)
					exp = (int32_t)s1 > (int32_t)s2 ? s1 : s2;
				else
					exp = s1 > s2 ? s1 : s2;
				break;
			case 7: /* min */
				if (sz == 7)
					exp = (int32_t)s1 < (int32_t)s2 ? s1 : s2;
				else
					exp = s1 < s2 ? s1 : s2;
				break;
			case 0xa:
				exp = s1 & s2;
				break;
			case 0xb:
				exp = s1 | s2;
				break;
			case 0xc:
				exp = s1 ^ s2;
				break;
			case 0x8:
			case 0x9:
			case 0xd:
			case 0xe:
			case 0xf:
				exp = s1;
				break;
			default:
				abort();
				break;
		}
		if (sz < 4 && ctx->chipset.chipset >= 0xa0)
			exp = s1;
		switch (sz) {
			case 0:
				expold = (uint8_t)expold;
				break;
			case 1:
				expold = (int8_t)expold;
				break;
			case 2:
				expold = (uint16_t)expold;
				break;
			case 3:
				expold = (int16_t)expold;
				break;
		}
		if (real != exp || cc != ecc || (is_atom && realold != expold)) {
			printf("atom32 %08x %08x (%08x %08x %08x %08x)[%d]: got %08x.%x %08x expected %08x.%x %08x\n", op1, op2, src1[i], src2[i], src3[i], s1, i&3, real, cc, realold, exp, ecc, expold);
			return 1;
		}
	}
	return 0;
}